

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if (vec->setupStatus == true) {
    piVar1 = (vec->super_IdxSet).idx;
    for (uVar2 = (ulong)(uint)(vec->super_IdxSet).num; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_80,vec,piVar1[uVar2 - 1]);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems._56_5_ = 0;
      result.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result.m_backend,&x->m_backend,&local_80);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                ((cpp_dec_float<100U,_int,_void> *)((long)piVar1[uVar2 - 1] * 0x50 + *(long *)this),
                 &result.m_backend);
    }
  }
  else {
    uVar2 = (*(long *)(this + 8) - *(long *)this) / 0x50;
    lVar3 = (uVar2 & 0xffffffff) * 0x50;
    while( true ) {
      if ((int)uVar2 < 1) break;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems._56_5_ = 0;
      result.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result.m_backend,&x->m_backend,
                 (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(vec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar3));
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                ((cpp_dec_float<100U,_int,_void> *)(*(long *)this + lVar3 + -0x50),&result.m_backend
                );
      uVar2 = (ulong)((int)uVar2 - 1);
      lVar3 = lVar3 + -0x50;
    }
  }
  return (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
VectorBase<R>& VectorBase<R>::multAdd(const S& x, const SSVectorBase<T>& vec)
{
   assert(vec.dim() <= dim());

   if(vec.isSetup())
   {
      const int* idx = vec.indexMem();

      for(int i = vec.size() - 1; i >= 0; --i)
         val[idx[i]] += x * vec[idx[i]];
   }
   else
   {
      assert(vec.dim() == dim());

      for(int i = dim() - 1; i >= 0; --i)
         val[i] += x * vec.val[i];
   }

   return *this;
}